

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O1

char * attr_string_from_atom(atom_t atom)

{
  char *pcVar1;
  
  if (global_as_lock != (atl_lock_func)0x0) {
    (*global_as_lock)(global_as_lock_data);
  }
  if (global_as == (atom_server)0x0) {
    global_as = init_atom_server(prefill_atom_cache);
    if (init_global_atom_server_first == '\0') {
      init_global_atom_server_first = '\x01';
    }
  }
  pcVar1 = string_from_atom(global_as,atom);
  if (global_as_unlock != (atl_lock_func)0x0) {
    (*global_as_unlock)(global_as_lock_data);
  }
  return pcVar1;
}

Assistant:

extern
char *
attr_string_from_atom(atom_t atom)
{
    char *tmp;
    atl_lock();
    init_global_atom_server(&global_as);
    tmp = string_from_atom(global_as, atom);
    atl_unlock();
    return tmp;
}